

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O0

void ncnn::dynamic_quantize_2d(Mat *blob,Mat *blob_int8,float *scale,Option *opt)

{
  char cVar1;
  long lVar2;
  float *pfVar3;
  Mat *in_RCX;
  float *in_RDX;
  long *in_RSI;
  long *in_RDI;
  double dVar4;
  int j_1;
  char *outptr;
  float *ptr_1;
  int i_1;
  int j;
  float *ptr;
  int i;
  float absmax;
  float local_88;
  int local_84;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  float local_68;
  int in_stack_ffffffffffffff9c;
  int iVar5;
  size_t in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int iVar6;
  float in_stack_ffffffffffffffac;
  
  Mat::create(in_RCX,(int)in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
              in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
              (Allocator *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_88 = 0.0;
  for (iVar6 = 0; iVar6 < (int)in_RSI[6]; iVar6 = iVar6 + 1) {
    lVar2 = *in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)iVar6 * in_RDI[2];
    for (iVar5 = 0; iVar5 < *(int *)((long)in_RSI + 0x2c); iVar5 = iVar5 + 1) {
      dVar4 = std::fabs((double)(ulong)*(uint *)(lVar2 + (long)iVar5 * 4));
      local_68 = SUB84(dVar4,0);
      pfVar3 = std::max<float>((float *)&stack0xffffffffffffffac,&local_68);
      local_88 = *pfVar3;
    }
  }
  if ((local_88 != 0.0) || (NAN(local_88))) {
    local_88 = 127.0 / local_88;
  }
  else {
    local_88 = 1.0;
  }
  *in_RDX = local_88;
  for (iVar6 = 0; iVar6 < (int)in_RSI[6]; iVar6 = iVar6 + 1) {
    lVar2 = *in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)iVar6 * in_RSI[2];
    for (local_84 = 0; local_84 < *(int *)((long)in_RSI + 0x2c); local_84 = local_84 + 1) {
      cVar1 = float2int8((float)lVar2);
      *(char *)(lVar2 + local_84) = cVar1;
    }
  }
  return;
}

Assistant:

static void dynamic_quantize_2d(const Mat& blob, Mat& blob_int8, float& scale, const Option& opt)
{
    blob_int8.create(blob.w, blob.h, (size_t)1u, 1, opt.workspace_allocator);

    float absmax = 0.f;
    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);

        for (int j = 0; j < blob_int8.w; j++)
        {
            absmax = std::max(absmax, (float)fabs(ptr[j]));
        }
    }

    scale = absmax == 0.f ? 1.f : 127.f / absmax;

    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);
        signed char* outptr = blob_int8.row<signed char>(i);

        for (int j = 0; j < blob_int8.w; j++)
        {
            outptr[j] = float2int8(ptr[j] * scale);
        }
    }
}